

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O3

ssize_t __thiscall LASinterval::read(LASinterval *this,int __fd,void *__buf,size_t __nbytes)

{
  LASintervalStartCell *pLVar1;
  LASintervalStartCell *this_00;
  LASintervalStartCell *this_01;
  undefined8 unaff_RBX;
  undefined4 in_register_00000034;
  long *plVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>,_bool>
  pVar3;
  U32 number_cells;
  char signature [4];
  U32 number_points;
  I32 cell_index;
  U32 number_intervals;
  U32 version;
  int local_58;
  int local_54;
  U32 local_50;
  int local_4c;
  int local_48 [2];
  LASintervalStartCell *local_40;
  undefined1 local_34 [4];
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  (**(code **)(*plVar2 + 8))(plVar2,&local_54,4);
  if (local_54 == 0x5653414c) {
    (**(code **)(*plVar2 + 0x18))(plVar2,local_34);
    (**(code **)(*plVar2 + 0x18))(plVar2,&local_58);
    this_01 = (LASintervalStartCell *)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    if (local_58 != 0) {
      do {
        (**(code **)(*plVar2 + 0x18))(plVar2,&local_4c);
        this_00 = (LASintervalStartCell *)operator_new(0x20);
        LASintervalStartCell::LASintervalStartCell(this_00);
        local_48[0] = local_4c;
        local_40 = this_00;
        pVar3 = std::
                _Hashtable<int,std::pair<int_const,LASintervalStartCell*>,std::allocator<std::pair<int_const,LASintervalStartCell*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<int_const,LASintervalStartCell*>>
                          ((_Hashtable<int,std::pair<int_const,LASintervalStartCell*>,std::allocator<std::pair<int_const,LASintervalStartCell*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)this->cells,local_48);
        (**(code **)(*plVar2 + 0x18))(plVar2,local_48,pVar3._8_8_);
        (**(code **)(*plVar2 + 0x18))(plVar2,&local_50);
        this_00->full = local_50;
        this_00->total = 0;
        pLVar1 = this_00;
        while (local_48[0] != 0) {
          (**(code **)(*plVar2 + 0x18))(plVar2,pLVar1);
          this_01 = (LASintervalStartCell *)&(pLVar1->super_LASintervalCell).end;
          (**(code **)(*plVar2 + 0x18))(plVar2,this_01);
          this_00->total =
               ((pLVar1->super_LASintervalCell).end - (pLVar1->super_LASintervalCell).start) +
               this_00->total + 1;
          local_48[0] = local_48[0] + -1;
          if (local_48[0] == 0) break;
          this_01 = (LASintervalStartCell *)operator_new(0x10);
          LASintervalCell::LASintervalCell((LASintervalCell *)this_01);
          (pLVar1->super_LASintervalCell).next = (LASintervalCell *)this_01;
          pLVar1 = this_01;
        }
        local_58 = local_58 + -1;
      } while (local_58 != 0);
      this_01 = (LASintervalStartCell *)CONCAT71((int7)((ulong)this_01 >> 8),1);
    }
  }
  else {
    this_01 = (LASintervalStartCell *)0x0;
    LASMessage(LAS_ERROR,"(LASinterval): wrong signature %4s instead of \'LASV\'",&local_54);
    if (halt_on_error == true) {
      byebye();
      this_01 = (LASintervalStartCell *)0x0;
    }
  }
  return (ulong)this_01 & 0xffffffff;
}

Assistant:

BOOL LASinterval::read(ByteStreamIn* stream)
{
  char signature[4];
  try { stream->getBytes((U8*)signature, 4); } catch (...)
  {
    laserror("(LASinterval): reading signature");
    return FALSE;
  }
  if (strncmp(signature, "LASV", 4) != 0)
  {
    laserror("(LASinterval): wrong signature %4s instead of 'LASV'", signature);
    return FALSE;
  }
  U32 version;
  try { stream->get32bitsLE((U8*)&version); } catch (...)
  {
    laserror("(LASinterval): reading version");
    return FALSE;
  }
  // read number of cells
  U32 number_cells;
  try { stream->get32bitsLE((U8*)&number_cells); } catch (...)
  {
    laserror("(LASinterval): reading number of cells");
    return FALSE;
  }
  // loop over all cells
  while (number_cells)
  {
    // read index of cell
    I32 cell_index;
    try { stream->get32bitsLE((U8*)&cell_index); } catch (...)
    {
      laserror("(LASinterval): reading cell index");
      return FALSE;
    }
    // create cell and insert into hash
    LASintervalStartCell* start_cell = new LASintervalStartCell();
    ((my_cell_hash*)cells)->insert(my_cell_hash::value_type(cell_index, start_cell));
    LASintervalCell* cell = start_cell;
    // read number of intervals in cell
    U32 number_intervals;
    try { stream->get32bitsLE((U8*)&number_intervals); } catch (...)
    {
      laserror("(LASinterval): reading number of intervals in cell");
      return FALSE;
    }
    // read number of points in cell
    U32 number_points;
    try { stream->get32bitsLE((U8*)&number_points); } catch (...)
    {
      laserror("(LASinterval): reading number of points in cell");
      return FALSE;
    }
    start_cell->full = number_points;
    start_cell->total = 0;
    while (number_intervals)
    {
      // read start of interval
      try { stream->get32bitsLE((U8*)&(cell->start)); } catch (...)
      {
        laserror("(LASinterval): reading start %d of interval", cell->start);
        return FALSE;
      }
      // read end of interval
      try { stream->get32bitsLE((U8*)&(cell->end)); } catch (...)
      {
        laserror("(LASinterval): reading end %d of interval", cell->end);
        return FALSE;
      }
      start_cell->total += (cell->end - cell->start + 1);
      number_intervals--;
      if (number_intervals)
      {
        cell->next = new LASintervalCell();
        cell = cell->next;
      }
    }
    number_cells--;
  }

  return TRUE;
}